

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_test.cc
# Opt level: O2

void __thiscall ErrTest_String_Test::~ErrTest_String_Test(ErrTest_String_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ErrTest, String) {
  char buf[128];
  uint32_t err = ERR_PACK(ERR_LIB_CRYPTO, ERR_R_INTERNAL_ERROR);

  EXPECT_STREQ(
      "error:0e000044:common libcrypto routines:OPENSSL_internal:internal "
      "error",
      ERR_error_string_n(err, buf, sizeof(buf)));

  // The buffer is exactly the right size.
  EXPECT_STREQ(
      "error:0e000044:common libcrypto routines:OPENSSL_internal:internal "
      "error",
      ERR_error_string_n(err, buf, 73));

  // If the buffer is too short, the string is truncated.
  EXPECT_STREQ(
      "error:0e000044:common libcrypto routines:OPENSSL_internal:internal "
      "erro",
      ERR_error_string_n(err, buf, 72));
  EXPECT_STREQ("error:0e000044:common libcrypto routines:OPENSSL_internal:",
               ERR_error_string_n(err, buf, 59));

  // Truncated log lines always have the right number of colons.
  EXPECT_STREQ("error:0e000044:common libcrypto routines:OPENSSL_interna:",
               ERR_error_string_n(err, buf, 58));
  EXPECT_STREQ("error:0e000044:common libcrypto routines:OPENSSL_intern:",
               ERR_error_string_n(err, buf, 57));
  EXPECT_STREQ("error:0e000044:common libcryp::",
               ERR_error_string_n(err, buf, 32));
  EXPECT_STREQ("error:0e0000:::",
               ERR_error_string_n(err, buf, 16));
  EXPECT_STREQ("err::::",
               ERR_error_string_n(err, buf, 8));
  EXPECT_STREQ("::::",
               ERR_error_string_n(err, buf, 5));

  // If the buffer is too short for even four colons, |ERR_error_string_n| does
  // not bother trying to preserve the format.
  EXPECT_STREQ("err", ERR_error_string_n(err, buf, 4));
  EXPECT_STREQ("er", ERR_error_string_n(err, buf, 3));
  EXPECT_STREQ("e", ERR_error_string_n(err, buf, 2));
  EXPECT_STREQ("", ERR_error_string_n(err, buf, 1));

  // A buffer length of zero should not touch the buffer.
  ERR_error_string_n(err, nullptr, 0);

  EXPECT_STREQ(ERR_lib_error_string(err), "common libcrypto routines");
  EXPECT_STREQ(ERR_lib_symbol_name(err), "CRYPTO");
  EXPECT_STREQ(ERR_reason_error_string(err), "internal error");
  EXPECT_STREQ(ERR_reason_symbol_name(err), "INTERNAL_ERROR");

  // Check a normal error.
  err = ERR_PACK(ERR_LIB_EVP, EVP_R_DECODE_ERROR);
  EXPECT_STREQ(ERR_lib_error_string(err), "public key routines");
  EXPECT_STREQ(ERR_lib_symbol_name(err), "EVP");
  EXPECT_STREQ(ERR_reason_error_string(err), "DECODE_ERROR");
  EXPECT_STREQ(ERR_reason_symbol_name(err), "DECODE_ERROR");

  // Check an error that forwards to another library.
  err = ERR_PACK(ERR_LIB_EVP, ERR_R_BN_LIB);
  EXPECT_STREQ(ERR_lib_error_string(err), "public key routines");
  EXPECT_STREQ(ERR_lib_symbol_name(err), "EVP");
  EXPECT_STREQ(ERR_reason_error_string(err), "bignum routines");
  EXPECT_STREQ(ERR_reason_symbol_name(err), "BN_LIB");

  // Errors in |ERR_LIB_SYS| are |errno| values, so we don't have their symbolic
  // names. Their human-readable strings are OS- and even locale-dependent.
  err = ERR_PACK(ERR_LIB_SYS, ERANGE);
  EXPECT_STREQ(ERR_lib_error_string(err), "system library");
  EXPECT_STREQ(ERR_lib_symbol_name(err), "SYS");
  EXPECT_NE(ERR_reason_error_string(err), nullptr);
  EXPECT_STRNE(ERR_reason_error_string(err), "unknown error");
  EXPECT_EQ(ERR_reason_symbol_name(err), nullptr);
}